

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessShaderDeclaration
          (ConversionStream *this,iterator EntryPointToken,SHADER_TYPE ShaderType)

{
  TokenListType *this_00;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var1;
  iterator __position;
  ostream *poVar2;
  string *_Delimiter;
  char *pcVar3;
  char (*in_R8) [21];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  pointer pSVar4;
  bool bIsVoid;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_370;
  iterator FirstStatementToken;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> local_360;
  char *EntryPoint;
  iterator BodyEndToken;
  String local_348;
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ShaderParams;
  String Prologue;
  String GlobalVariables;
  string err_1;
  iterator ArgsListEndToken;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream ReturnHandlerSS;
  ostream local_1a0 [376];
  
  EntryPoint = (char *)EntryPointToken._M_node[1]._M_prev;
  local_370._M_node = (EntryPointToken._M_node)->_M_prev;
  if (local_370._M_node ==
      (this->m_Tokens).
      super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
      ._M_impl._M_node.super__List_node_base._M_next) {
    FormatString<char[11],std::__cxx11::string,char[21]>
              ((string *)&ReturnHandlerSS,(Diligent *)"Function \"",
               (char (*) [11])&EntryPointToken._M_node[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\" misses return type",in_R8);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&err_1,this,&local_370,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessShaderDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x1027,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ReturnHandlerSS,(char (*) [2])0x70fe85,&err_1);
    std::__cxx11::string::~string((string *)&err_1);
    std::__cxx11::string::~string((string *)&ReturnHandlerSS);
  }
  ShaderParams.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ShaderParams.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ShaderParams.
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bIsVoid = false;
  ArgsListEndToken._M_node = local_370._M_node;
  ProcessFunctionParameters(this,&ArgsListEndToken,&ShaderParams,&bIsVoid);
  std::__cxx11::string::assign((char *)&EntryPointToken._M_node[1]._M_prev);
  std::__cxx11::stringstream::stringstream((stringstream *)&ReturnHandlerSS);
  poVar2 = std::operator<<(local_1a0,"#define ");
  poVar2 = std::operator<<(poVar2,"_RETURN_");
  pcVar3 = "(_RET_VAL_)";
  if (bIsVoid != false) {
    pcVar3 = "";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2," {\\\n");
  GlobalVariables._M_dataplus._M_p = (pointer)&GlobalVariables.field_2;
  GlobalVariables._M_string_length = 0;
  Prologue._M_dataplus._M_p = (pointer)&Prologue.field_2;
  Prologue._M_string_length = 0;
  GlobalVariables.field_2._M_local_buf[0] = '\0';
  Prologue.field_2._M_local_buf[0] = '\0';
  switch(ShaderType) {
  case SHADER_TYPE_VERTEX:
    ProcessVertexShaderArguments(this,&ShaderParams,&GlobalVariables,&ReturnHandlerSS,&Prologue);
    break;
  case SHADER_TYPE_PIXEL:
    ProcessFragmentShaderArguments
              (this,&local_370,&ShaderParams,&GlobalVariables,&ReturnHandlerSS,&Prologue);
    break;
  case SHADER_TYPE_VS_PS:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_VERTEX:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_PIXEL:
  case SHADER_TYPE_GEOMETRY|SHADER_TYPE_VS_PS:
    break;
  case SHADER_TYPE_GEOMETRY:
    ProcessGeometryShaderArguments(this,&local_370,&ShaderParams,&GlobalVariables,&Prologue);
    break;
  case SHADER_TYPE_HULL:
    ProcessHullShaderArguments
              (this,&local_370,&ShaderParams,&GlobalVariables,&ReturnHandlerSS,&Prologue);
    break;
  default:
    if (ShaderType == SHADER_TYPE_DOMAIN) {
      ProcessDomainShaderArguments
                (this,&local_370,&ShaderParams,&GlobalVariables,&ReturnHandlerSS,&Prologue);
    }
    else if (ShaderType == SHADER_TYPE_COMPUTE) {
      ProcessComputeShaderArguments(this,&local_370,&ShaderParams,&GlobalVariables,&Prologue);
    }
  }
  std::operator<<(local_1a0,"return;}\n");
  _Var1._M_node = local_370._M_node;
  std::__cxx11::string::string
            ((string *)&local_1d0,GlobalVariables._M_dataplus._M_p,(allocator *)&local_348);
  std::__cxx11::string::string
            ((string *)&local_1f0,(char *)local_370._M_node[3]._M_prev,(allocator *)&local_360);
  this_00 = &this->m_Tokens;
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&err_1,TextBlock,&local_1d0,&local_1f0,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            (this_00,(const_iterator)_Var1._M_node,(HLSLTokenInfo *)&err_1);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err_1);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  _Var1._M_node = local_370._M_node;
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string
            ((string *)&local_210,local_348._M_dataplus._M_p,(allocator *)&local_360);
  std::__cxx11::string::string((string *)&local_230,"\n",(allocator *)&FirstStatementToken);
  Args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff;
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&err_1,TextBlock,&local_210,&local_230,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            (this_00,(const_iterator)_Var1._M_node,(HLSLTokenInfo *)&err_1);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err_1);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::assign((char *)&local_370._M_node[3]._M_prev);
  for (local_360._M_node = ArgsListEndToken._M_node; (_List_node_base *)this_00 != local_360._M_node
      ; local_360._M_node = (local_360._M_node)->_M_next) {
    if (*(int *)&local_360._M_node[1]._M_next == 0x133) goto LAB_0033c3ba;
  }
  FormatString<char[74],char_const*,char[3]>
            (&err_1,(Diligent *)
                    "Unexpected end of file while looking for the body of shader entry point \"",
             (char (*) [74])&EntryPoint,(char **)0x720dfa,(char (*) [3])Args);
  PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
            (&local_348,this,&local_360,4);
  Args = &err_1;
  LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
            (false,"ProcessShaderDeclaration",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
             ,0x1069,Args,(char (*) [2])0x70fe85,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&err_1);
LAB_0033c3ba:
  FirstStatementToken._M_node = (local_360._M_node)->_M_next;
  if (FirstStatementToken._M_node == (_List_node_base *)this_00) {
    FormatString<char[74],char_const*,char[3]>
              (&err_1,(Diligent *)
                      "Unexpected end of file while looking for the body of shader entry point \"",
               (char (*) [74])&EntryPoint,(char **)0x720dfa,(char (*) [3])Args);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&local_348,this,&FirstStatementToken,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessShaderDeclaration",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x1070,&err_1,(char (*) [2])0x70fe85,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&err_1);
  }
  __position._M_node = FirstStatementToken._M_node;
  std::__cxx11::string::string
            ((string *)&local_250,Prologue._M_dataplus._M_p,(allocator *)&local_348);
  std::__cxx11::string::string((string *)&local_270,"\n",(allocator *)&BodyEndToken);
  _Delimiter = &local_270;
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&err_1,TextBlock,&local_250,_Delimiter,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>
            (this_00,(const_iterator)__position._M_node,(HLSLTokenInfo *)&err_1);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&err_1);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  BodyEndToken._M_node = local_360._M_node;
  if (ShaderType < (SHADER_TYPE_DOMAIN|SHADER_TYPE_VERTEX)) {
    if ((0x10106U >> (ShaderType & SHADER_TYPE_ALL_GRAPHICS) & 1) == 0) {
      pSVar4 = ShaderParams.
               super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (ShaderType == SHADER_TYPE_GEOMETRY) {
        for (; pSVar4 != ShaderParams.
                         super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish; pSVar4 = pSVar4 + 1) {
          if ((pSVar4->GSAttribs).Stream != Undefined) goto LAB_0033c5f2;
        }
        FormatString<char[38]>(&err_1,(char (*) [38])"Unable to find output stream variable");
        PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                  (&local_348,this,&FirstStatementToken,4);
        _Delimiter = (string *)0x1080;
        LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                  (false,"ProcessShaderDeclaration",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0x1080,&err_1,(char (*) [2])0x70fe85,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        std::__cxx11::string::~string((string *)&err_1);
LAB_0033c5f2:
        ProcessGSOutStreamOperations(this,&BodyEndToken,&pSVar4->Name,(char *)_Delimiter);
      }
    }
    else {
      ProcessReturnStatements(this,&BodyEndToken,bIsVoid,EntryPoint,"_RETURN_");
    }
  }
  std::__cxx11::string::~string((string *)&Prologue);
  std::__cxx11::string::~string((string *)&GlobalVariables);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ReturnHandlerSS);
  std::
  vector<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo>_>
  ::~vector(&ShaderParams);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessShaderDeclaration(TokenListType::iterator EntryPointToken, SHADER_TYPE ShaderType)
{
    const auto* EntryPoint = EntryPointToken->Literal.c_str();

    auto TypeToken = EntryPointToken;
    --TypeToken;
    // void TestPS  ( in VSOutput In,
    // ^
    // TypeToken
    VERIFY_PARSER_STATE(TypeToken, TypeToken != m_Tokens.begin(), "Function \"", EntryPointToken->Literal, "\" misses return type");

    std::vector<ShaderParameterInfo> ShaderParams;

    auto ArgsListEndToken = TypeToken;
    bool bIsVoid          = false;
    ProcessFunctionParameters(ArgsListEndToken, ShaderParams, bIsVoid);

    EntryPointToken->Literal = "main";
    //void main ()

    std::stringstream ReturnHandlerSS;
    const Char*       ReturnMacroName = "_RETURN_";
    // Some GLES compilers cannot properly handle macros with empty argument lists, such as _RETURN_().
    // Also, some compilers generate an error if there is no whitespace after the macro without arguments: _RETURN_{
    ReturnHandlerSS << "#define " << ReturnMacroName << (bIsVoid ? "" : "(_RET_VAL_)") << " {\\\n";

    String GlobalVariables, Prologue;
    try
    {
        if (ShaderType == SHADER_TYPE_PIXEL)
        {
            ProcessFragmentShaderArguments(TypeToken, ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_VERTEX)
        {
            ProcessVertexShaderArguments(ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_GEOMETRY)
        {
            ProcessGeometryShaderArguments(TypeToken, ShaderParams, GlobalVariables, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_HULL)
        {
            ProcessHullShaderArguments(TypeToken, ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_DOMAIN)
        {
            ProcessDomainShaderArguments(TypeToken, ShaderParams, GlobalVariables, ReturnHandlerSS, Prologue);
        }
        else if (ShaderType == SHADER_TYPE_COMPUTE)
        {
            ProcessComputeShaderArguments(TypeToken, ShaderParams, GlobalVariables, Prologue);
        }
    }
    catch (const std::runtime_error&)
    {
        LOG_ERROR_AND_THROW("Failed to process shader parameters for shader \"", EntryPoint, "\".");
    }
    ReturnHandlerSS << "return;}\n";


    // void main ()
    // ^
    // TypeToken

    // Insert global variables & return handler before the function
    m_Tokens.insert(TypeToken, TokenInfo(TokenType::TextBlock, GlobalVariables.c_str(), TypeToken->Delimiter.c_str()));
    m_Tokens.insert(TypeToken, TokenInfo(TokenType::TextBlock, ReturnHandlerSS.str().c_str(), "\n"));
    TypeToken->Delimiter = "\n";
    auto BodyStartToken  = ArgsListEndToken;
    while (BodyStartToken != m_Tokens.end() && BodyStartToken->Type != TokenType::OpenBrace)
        ++BodyStartToken;
    // void main ()
    // {
    // ^
    VERIFY_PARSER_STATE(BodyStartToken, BodyStartToken != m_Tokens.end(), "Unexpected end of file while looking for the body of shader entry point \"", EntryPoint, "\".");
    auto FirstStatementToken = BodyStartToken;
    ++FirstStatementToken;
    // void main ()
    // {
    //      int a;
    //      ^
    VERIFY_PARSER_STATE(FirstStatementToken, FirstStatementToken != m_Tokens.end(), "Unexpected end of file while looking for the body of shader entry point \"", EntryPoint, "\".");

    // Insert prologue before the first token
    m_Tokens.insert(FirstStatementToken, TokenInfo(TokenType::TextBlock, Prologue.c_str(), "\n"));

    auto BodyEndToken = BodyStartToken;
    if (ShaderType == SHADER_TYPE_VERTEX || ShaderType == SHADER_TYPE_HULL || ShaderType == SHADER_TYPE_DOMAIN || ShaderType == SHADER_TYPE_PIXEL)
    {
        ProcessReturnStatements(BodyEndToken, bIsVoid, EntryPoint, ReturnMacroName);
    }
    else if (ShaderType == SHADER_TYPE_GEOMETRY)
    {
        auto OutStreamParamIt = ShaderParams.begin();
        for (; OutStreamParamIt != ShaderParams.end(); ++OutStreamParamIt)
            if (OutStreamParamIt->GSAttribs.Stream != ShaderParameterInfo::GSAttributes::StreamType::Undefined)
                break;
        VERIFY_PARSER_STATE(FirstStatementToken, OutStreamParamIt != ShaderParams.end(), "Unable to find output stream variable");
        ProcessGSOutStreamOperations(BodyEndToken, OutStreamParamIt->Name, EntryPoint);
    }
}